

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O0

ClassBuilder * __thiscall
Lodtalk::ClassBuilder::addClassMethod(ClassBuilder *this,char *name,PrimitiveFunction primitive)

{
  mapped_type *pp_Var1;
  allocator local_41;
  key_type local_40;
  PrimitiveFunction local_20;
  PrimitiveFunction primitive_local;
  char *name_local;
  ClassBuilder *this_local;
  
  local_20 = primitive;
  primitive_local = (PrimitiveFunction)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  pp_Var1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>_>_>
            ::operator[](&this->classSidePrimitiveMethods,&local_40);
  *pp_Var1 = primitive;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return this;
}

Assistant:

ClassBuilder &ClassBuilder::addClassMethod(const char *name, PrimitiveFunction primitive)
{
    classSidePrimitiveMethods[name] = primitive;
    return *this;
}